

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStencilbufferTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::FboStencilTests::init(FboStencilTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 internalFormat;
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  TextureFormat TVar3;
  BasicFboStencilCase *pBVar4;
  char *pcVar5;
  DepthStencilAttachCase *pDVar6;
  long lVar7;
  allocator<char> local_89;
  TestNode *local_88;
  IVec2 local_80;
  IVec2 local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Basic stencil tests");
  local_88 = pTVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  for (lVar7 = 0; lVar7 != 0xc; lVar7 = lVar7 + 4) {
    internalFormat = *(deUint32 *)((long)init::stencilFormats + lVar7);
    TVar3 = glu::mapGLInternalFormat(internalFormat);
    pBVar4 = (BasicFboStencilCase *)operator_new(0x98);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar5 = FboTestUtil::getFormatName(internalFormat);
    local_78.m_data[0] = 0x6f;
    local_78.m_data[1] = 0x84;
    BasicFboStencilCase::BasicFboStencilCase
              (pBVar4,pCVar1,pcVar5,glcts::fixed_sample_locations_values + 1,internalFormat,
               &local_78,false);
    tcu::TestNode::addChild(local_88,(TestNode *)pBVar4);
    if (TVar3.order == DS) {
      pBVar4 = (BasicFboStencilCase *)operator_new(0x98);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar5 = FboTestUtil::getFormatName(internalFormat);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar5,&local_89);
      std::operator+(&local_70,&local_50,"_depth");
      local_80.m_data[0] = 0x6f;
      local_80.m_data[1] = 0x84;
      BasicFboStencilCase::BasicFboStencilCase
                (pBVar4,pCVar1,local_70._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
                 internalFormat,&local_80,true);
      tcu::TestNode::addChild(local_88,(TestNode *)pBVar4);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"attach",
             "Attaching depth stencil");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pDVar6 = (DepthStencilAttachCase *)operator_new(0x90);
  DepthStencilAttachCase::DepthStencilAttachCase
            (pDVar6,(this->super_TestCaseGroup).m_context,"depth_only",
             "Only depth part of depth-stencil RBO attached",0x8d00,0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pDVar6);
  pDVar6 = (DepthStencilAttachCase *)operator_new(0x90);
  DepthStencilAttachCase::DepthStencilAttachCase
            (pDVar6,(this->super_TestCaseGroup).m_context,"stencil_only",
             "Only stencil part of depth-stencil RBO attached",0,0x8d20);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pDVar6);
  pDVar6 = (DepthStencilAttachCase *)operator_new(0x90);
  DepthStencilAttachCase::DepthStencilAttachCase
            (pDVar6,(this->super_TestCaseGroup).m_context,"depth_stencil_separate",
             "Depth and stencil attached separately",0x8d00,0x8d20);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pDVar6);
  pDVar6 = (DepthStencilAttachCase *)operator_new(0x90);
  DepthStencilAttachCase::DepthStencilAttachCase
            (pDVar6,(this->super_TestCaseGroup).m_context,"depth_stencil_attachment",
             "Depth and stencil attached with DEPTH_STENCIL_ATTACHMENT",0x821a,0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pDVar6);
  return extraout_EAX;
}

Assistant:

void FboStencilTests::init (void)
{
	static const deUint32 stencilFormats[] =
	{
		GL_DEPTH32F_STENCIL8,
		GL_DEPTH24_STENCIL8,
		GL_STENCIL_INDEX8
	};

	// .basic
	{
		tcu::TestCaseGroup* basicGroup = new tcu::TestCaseGroup(m_testCtx, "basic", "Basic stencil tests");
		addChild(basicGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(stencilFormats); fmtNdx++)
		{
			deUint32			format		= stencilFormats[fmtNdx];
			tcu::TextureFormat	texFmt		= glu::mapGLInternalFormat(format);

			basicGroup->addChild(new BasicFboStencilCase(m_context, getFormatName(format), "", format, IVec2(111, 132), false));

			if (texFmt.order == tcu::TextureFormat::DS)
				basicGroup->addChild(new BasicFboStencilCase(m_context, (string(getFormatName(format)) + "_depth").c_str(), "", format, IVec2(111, 132), true));
		}
	}

	// .attach
	{
		tcu::TestCaseGroup* attachGroup = new tcu::TestCaseGroup(m_testCtx, "attach", "Attaching depth stencil");
		addChild(attachGroup);

		attachGroup->addChild(new DepthStencilAttachCase(m_context, "depth_only",				"Only depth part of depth-stencil RBO attached",			GL_DEPTH_ATTACHMENT,			GL_NONE));
		attachGroup->addChild(new DepthStencilAttachCase(m_context, "stencil_only",				"Only stencil part of depth-stencil RBO attached",			GL_NONE,						GL_STENCIL_ATTACHMENT));
		attachGroup->addChild(new DepthStencilAttachCase(m_context, "depth_stencil_separate",	"Depth and stencil attached separately",					GL_DEPTH_ATTACHMENT,			GL_STENCIL_ATTACHMENT));
		attachGroup->addChild(new DepthStencilAttachCase(m_context, "depth_stencil_attachment",	"Depth and stencil attached with DEPTH_STENCIL_ATTACHMENT",	GL_DEPTH_STENCIL_ATTACHMENT,	GL_NONE));
	}
}